

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseEncoding(Db *this)

{
  byte bVar1;
  char *pcVar2;
  ForwardTemplateReference **ppFVar3;
  Node **ppNVar4;
  Node **ppNVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  Node *pNVar9;
  Node *pNVar10;
  char *pcVar11;
  SpecialName *pSVar12;
  Node *pNVar13;
  byte *pbVar14;
  _func_int **pp_Var15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  ForwardTemplateReference *pFVar19;
  size_t sVar20;
  ulong uVar21;
  Node NVar22;
  StringView SVar23;
  NodeArray NVar24;
  Node *Arg;
  NameState NameInfo;
  Node *local_60;
  NameState local_58;
  Node *local_40;
  _func_int **local_38;
  
  pcVar11 = this->First;
  pcVar2 = this->Last;
  if (pcVar2 == pcVar11) {
LAB_001d23fc:
    local_58._0_8_ = ((ulong)local_58._0_8_ >> 0x10 & 0xffff) << 0x10;
    local_58.ReferenceQualifier = FrefQualNone;
    local_58.ForwardTemplateRefsBegin =
         (long)(this->ForwardTemplateRefs).Last - (long)(this->ForwardTemplateRefs).First >> 3;
    pNVar9 = parseName(this,&local_58);
    if (pNVar9 == (Node *)0x0) {
      return (Node *)0x0;
    }
    ppFVar3 = (this->ForwardTemplateRefs).First;
    uVar17 = (long)(this->ForwardTemplateRefs).Last - (long)ppFVar3 >> 3;
    if (local_58.ForwardTemplateRefsBegin < uVar17) {
      ppNVar4 = (this->TemplateParams).First;
      uVar18 = (long)(this->TemplateParams).Last - (long)ppNVar4 >> 3;
      pFVar19 = ppFVar3[local_58.ForwardTemplateRefsBegin];
      uVar21 = pFVar19->Index;
      if (uVar18 <= uVar21) {
        return (Node *)0x0;
      }
      sVar20 = local_58.ForwardTemplateRefsBegin;
      do {
        pFVar19->Ref = ppNVar4[uVar21];
        if (uVar17 - 1 == sVar20) goto LAB_001d24af;
        pFVar19 = ppFVar3[sVar20 + 1];
        uVar21 = pFVar19->Index;
        sVar20 = sVar20 + 1;
      } while (uVar21 < uVar18);
      if (sVar20 < uVar17) {
        return (Node *)0x0;
      }
    }
    else {
LAB_001d24af:
      if (uVar17 < local_58.ForwardTemplateRefsBegin) {
        __assert_fail("Index <= size() && \"dropBack() can\'t expand!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0x780,
                      "void (anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::dropBack(size_t) [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                     );
      }
      (this->ForwardTemplateRefs).Last = ppFVar3 + local_58.ForwardTemplateRefsBegin;
    }
    pbVar14 = (byte *)this->First;
    pbVar16 = (byte *)this->Last;
    if (pbVar16 == pbVar14) {
      return pNVar9;
    }
    if ((*pbVar14 - 0x2e < 0x32) &&
       ((0x2000000800001U >> ((ulong)(*pbVar14 - 0x2e) & 0x3f) & 1) != 0)) {
      return pNVar9;
    }
    if (((ulong)((long)pbVar16 - (long)pbVar14) < 0xd) ||
       (*(long *)(pbVar14 + 5) != 0x4966695f656c6261 || *(long *)pbVar14 != 0x6c62616e65396155)) {
      pp_Var15 = (_func_int **)0x0;
    }
    else {
      pbVar14 = pbVar14 + 0xd;
      this->First = (char *)pbVar14;
      ppNVar4 = (this->Names).Last;
      ppNVar5 = (this->Names).First;
      while ((pbVar14 == pbVar16 || (*pbVar14 != 0x45))) {
        local_60 = parseTemplateArg(this);
        if (local_60 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_60);
        pbVar16 = (byte *)this->Last;
        pbVar14 = (byte *)this->First;
      }
      this->First = (char *)(pbVar14 + 1);
      NVar24 = popTrailingNodeArray(this,(long)ppNVar4 - (long)ppNVar5 >> 3);
      pp_Var15 = (_func_int **)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      *(undefined4 *)(pp_Var15 + 1) = 0x1010109;
      *pp_Var15 = (_func_int *)&PTR_hasRHSComponentSlow_0023e758;
      *(NodeArray *)(pp_Var15 + 2) = NVar24;
    }
    if ((local_58.CtorDtorConversion == false) && (local_58.EndsWithTemplateArgs == true)) {
      pNVar10 = parseType(this);
      if (pNVar10 == (Node *)0x0) {
        return (Node *)0x0;
      }
    }
    else {
      pNVar10 = (Node *)0x0;
    }
    pcVar11 = this->First;
    if ((pcVar11 == this->Last) || (*pcVar11 != 'v')) {
      ppNVar4 = (this->Names).Last;
      ppNVar5 = (this->Names).First;
      local_40 = pNVar10;
      local_38 = pp_Var15;
      do {
        local_60 = parseType(this);
        if (local_60 == (Node *)0x0) {
          return (Node *)0x0;
        }
        PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_60);
      } while ((this->Last != this->First) &&
              ((uVar8 = (byte)*this->First - 0x2e, 0x31 < uVar8 ||
               ((0x2000000800001U >> ((ulong)uVar8 & 0x3f) & 1) == 0))));
      NVar22 = (Node)popTrailingNodeArray(this,(long)ppNVar4 - (long)ppNVar5 >> 3);
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
      pNVar13->K = KFunctionEncoding;
      pNVar13->RHSComponentCache = Yes;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = Yes;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e7b0;
      pNVar13[1]._vptr_Node = (_func_int **)local_40;
      *(Node **)&pNVar13[1].K = pNVar9;
      pNVar13[2] = NVar22;
      pNVar13[3]._vptr_Node = local_38;
    }
    else {
      this->First = pcVar11 + 1;
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x40);
      pNVar13->K = KFunctionEncoding;
      pNVar13->RHSComponentCache = Yes;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = Yes;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023e7b0;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar10;
      *(Node **)&pNVar13[1].K = pNVar9;
      pNVar13[2]._vptr_Node = (_func_int **)0x0;
      pNVar13[2].K = KNodeArrayNode;
      pNVar13[2].RHSComponentCache = Yes;
      pNVar13[2].ArrayCache = Yes;
      pNVar13[2].FunctionCache = Yes;
      *(undefined4 *)&pNVar13[2].field_0xc = 0;
      pNVar13[3]._vptr_Node = pp_Var15;
    }
    pNVar13[3].K = (char)local_58.CVQualifiers;
    pNVar13[3].RHSComponentCache = (char)(local_58.CVQualifiers >> 8);
    pNVar13[3].ArrayCache = (char)(local_58.CVQualifiers >> 0x10);
    pNVar13[3].FunctionCache = (char)(local_58.CVQualifiers >> 0x18);
    pNVar13[3].field_0xc = local_58.ReferenceQualifier;
    return pNVar13;
  }
  if (*pcVar11 == 'G') {
    if ((ulong)((long)pcVar2 - (long)pcVar11) < 2) {
      return (Node *)0x0;
    }
    if (pcVar11[1] == 'R') {
      this->First = pcVar11 + 2;
      pNVar9 = parseName(this,(NameState *)0x0);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      bVar6 = parseSeqId(this,(size_t *)&local_58);
      pcVar11 = this->First;
      if ((pcVar11 == this->Last) || (*pcVar11 != '_')) {
        if (!bVar6) {
          return (Node *)0x0;
        }
      }
      else {
        this->First = pcVar11 + 1;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"reference temporary for ";
      pcVar11 = "";
    }
    else {
      if (pcVar11[1] != 'V') {
        return (Node *)0x0;
      }
      this->First = pcVar11 + 2;
      pNVar9 = parseName(this,(NameState *)0x0);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"guard variable for ";
      pcVar11 = "";
    }
    goto LAB_001d2af0;
  }
  if (*pcVar11 != 'T') goto LAB_001d23fc;
  if ((ulong)((long)pcVar2 - (long)pcVar11) < 2) goto switchD_001d23a0_caseD_55;
  bVar1 = pcVar11[1];
  if (bVar1 < 0x53) {
    if (bVar1 == 0x43) {
      this->First = pcVar11 + 2;
      pNVar9 = parseType(this);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      SVar23 = parseNumber(this,true);
      if (SVar23.First == SVar23.Last) {
        return (Node *)0x0;
      }
      pcVar11 = this->First;
      if (pcVar11 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar11 != '_') {
        return (Node *)0x0;
      }
      this->First = pcVar11 + 1;
      pNVar10 = parseType(this);
      if (pNVar10 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pNVar13 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar13->K = KCtorVtableSpecialName;
      pNVar13->RHSComponentCache = No;
      pNVar13->ArrayCache = No;
      pNVar13->FunctionCache = No;
      pNVar13->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d680;
      pNVar13[1]._vptr_Node = (_func_int **)pNVar10;
      *(Node **)&pNVar13[1].K = pNVar9;
      return pNVar13;
    }
    if (bVar1 == 0x48) {
      this->First = pcVar11 + 2;
      pNVar9 = parseName(this,(NameState *)0x0);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"thread-local initialization routine for ";
      pcVar11 = "";
      goto LAB_001d2af0;
    }
    if (bVar1 == 0x49) {
      this->First = pcVar11 + 2;
      pNVar9 = parseType(this);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"typeinfo for ";
      pcVar11 = "";
      goto LAB_001d2af0;
    }
    goto switchD_001d23a0_caseD_55;
  }
  switch(bVar1) {
  case 0x53:
    this->First = pcVar11 + 2;
    pNVar9 = parseType(this);
    if (pNVar9 != (Node *)0x0) {
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"typeinfo name for ";
      pcVar11 = "";
      goto LAB_001d2af0;
    }
    break;
  case 0x54:
    this->First = pcVar11 + 2;
    pNVar9 = parseType(this);
    if (pNVar9 != (Node *)0x0) {
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"VTT for ";
      pcVar11 = "";
      goto LAB_001d2af0;
    }
    break;
  case 0x56:
    this->First = pcVar11 + 2;
    pNVar9 = parseType(this);
    if (pNVar9 != (Node *)0x0) {
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)0x1fea1f;
      pcVar11 = "";
      goto LAB_001d2af0;
    }
    break;
  case 0x57:
    this->First = pcVar11 + 2;
    local_58._0_8_ = parseName(this,(NameState *)0x0);
    if ((Node *)local_58._0_8_ == (Node *)0x0) {
      return (Node *)0x0;
    }
    pSVar12 = (anonymous_namespace)::Db::
              make<(anonymous_namespace)::SpecialName,char_const(&)[34],(anonymous_namespace)::Node*&>
                        ((Db *)this,(char (*) [34])"thread-local wrapper routine for ",
                         (Node **)&local_58);
    return &pSVar12->super_Node;
  default:
    if (bVar1 == 99) {
      this->First = pcVar11 + 2;
      bVar6 = parseCallOffset(this);
      if (bVar6) {
        return (Node *)0x0;
      }
      bVar6 = parseCallOffset(this);
      if (bVar6) {
        return (Node *)0x0;
      }
      pNVar9 = parseEncoding(this);
      if (pNVar9 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      pNVar10[1]._vptr_Node = (_func_int **)"covariant return thunk to ";
      pcVar11 = "";
      goto LAB_001d2af0;
    }
  case 0x55:
switchD_001d23a0_caseD_55:
    pcVar11 = pcVar11 + 1;
    this->First = pcVar11;
    if (pcVar2 == pcVar11) {
      bVar6 = false;
    }
    else {
      bVar6 = *pcVar11 == 'v';
    }
    bVar7 = parseCallOffset(this);
    if ((!bVar7) && (pNVar9 = parseEncoding(this), pNVar9 != (Node *)0x0)) {
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      pNVar10->K = KSpecialName;
      pNVar10->RHSComponentCache = No;
      pNVar10->ArrayCache = No;
      pNVar10->FunctionCache = No;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d628;
      if (bVar6) {
        pNVar10[1]._vptr_Node = (_func_int **)0x1fe9d3;
        pcVar11 = "";
      }
      else {
        pNVar10[1]._vptr_Node = (_func_int **)"non-virtual thunk to ";
        pcVar11 = "";
      }
LAB_001d2af0:
      *(char **)&pNVar10[1].K = pcVar11;
      pNVar10[2]._vptr_Node = (_func_int **)pNVar9;
      return pNVar10;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseEncoding() {
  if (look() == 'G' || look() == 'T')
    return parseSpecialName();

  auto IsEndOfEncoding = [&] {
    // The set of chars that can potentially follow an <encoding> (none of which
    // can start a <type>). Enumerating these allows us to avoid speculative
    // parsing.
    return numLeft() == 0 || look() == 'E' || look() == '.' || look() == '_';
  };

  NameState NameInfo(this);
  Node *Name = parseName(&NameInfo);
  if (Name == nullptr)
    return nullptr;

  if (resolveForwardTemplateRefs(NameInfo))
    return nullptr;

  if (IsEndOfEncoding())
    return Name;

  Node *Attrs = nullptr;
  if (consumeIf("Ua9enable_ifI")) {
    size_t BeforeArgs = Names.size();
    while (!consumeIf('E')) {
      Node *Arg = parseTemplateArg();
      if (Arg == nullptr)
        return nullptr;
      Names.push_back(Arg);
    }
    Attrs = make<EnableIfAttr>(popTrailingNodeArray(BeforeArgs));
  }

  Node *ReturnType = nullptr;
  if (!NameInfo.CtorDtorConversion && NameInfo.EndsWithTemplateArgs) {
    ReturnType = parseType();
    if (ReturnType == nullptr)
      return nullptr;
  }

  if (consumeIf('v'))
    return make<FunctionEncoding>(ReturnType, Name, NodeArray(),
                                  Attrs, NameInfo.CVQualifiers,
                                  NameInfo.ReferenceQualifier);

  size_t ParamsBegin = Names.size();
  do {
    Node *Ty = parseType();
    if (Ty == nullptr)
      return nullptr;
    Names.push_back(Ty);
  } while (!IsEndOfEncoding());

  return make<FunctionEncoding>(ReturnType, Name,
                                popTrailingNodeArray(ParamsBegin),
                                Attrs, NameInfo.CVQualifiers,
                                NameInfo.ReferenceQualifier);
}